

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::HardSwish_x86_avx512::forward_inplace
          (HardSwish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 (*pauVar8) [64];
  int iVar9;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  float fVar18;
  undefined1 auVar20 [32];
  
  iVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar7 = 0;
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar7;
  }
  auVar12 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
  auVar15._8_4_ = 0x3f800000;
  auVar15._0_8_ = 0x3f8000003f800000;
  auVar15._12_4_ = 0x3f800000;
  auVar15._16_4_ = 0x3f800000;
  auVar15._20_4_ = 0x3f800000;
  auVar15._24_4_ = 0x3f800000;
  auVar15._28_4_ = 0x3f800000;
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  do {
    if (uVar7 == uVar6) {
      return 0;
    }
    pauVar8 = (undefined1 (*) [64])
              (bottom_top_blob->cstep * uVar7 * bottom_top_blob->elemsize +
              (long)bottom_top_blob->data);
    for (iVar9 = 0; iVar9 + 0xf < iVar5; iVar9 = iVar9 + 0x10) {
      auVar13 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_HardSwish).alpha));
      fVar1 = (this->super_HardSwish).beta;
      auVar14._4_4_ = fVar1;
      auVar14._0_4_ = fVar1;
      auVar14._8_4_ = fVar1;
      auVar14._12_4_ = fVar1;
      auVar14._16_4_ = fVar1;
      auVar14._20_4_ = fVar1;
      auVar14._24_4_ = fVar1;
      auVar14._28_4_ = fVar1;
      auVar14._32_4_ = fVar1;
      auVar14._36_4_ = fVar1;
      auVar14._40_4_ = fVar1;
      auVar14._44_4_ = fVar1;
      auVar14._48_4_ = fVar1;
      auVar14._52_4_ = fVar1;
      auVar14._56_4_ = fVar1;
      auVar14._60_4_ = fVar1;
      auVar14 = vfmadd213ps_avx512f(auVar13,*pauVar8,auVar14);
      auVar14 = vmaxps_avx512f(auVar14,ZEXT1664(ZEXT816(0) << 0x40));
      auVar14 = vminps_avx512f(auVar14,auVar12);
      auVar14 = vmulps_avx512f(auVar14,*pauVar8);
      *pauVar8 = auVar14;
      pauVar8 = pauVar8 + 1;
    }
    for (; iVar9 + 7 < iVar5; iVar9 = iVar9 + 8) {
      auVar2 = *(undefined1 (*) [32])*pauVar8;
      fVar1 = (this->super_HardSwish).alpha;
      auVar20._4_4_ = fVar1;
      auVar20._0_4_ = fVar1;
      auVar20._8_4_ = fVar1;
      auVar20._12_4_ = fVar1;
      auVar20._16_4_ = fVar1;
      auVar20._20_4_ = fVar1;
      auVar20._24_4_ = fVar1;
      auVar20._28_4_ = fVar1;
      fVar1 = (this->super_HardSwish).beta;
      auVar11._4_4_ = fVar1;
      auVar11._0_4_ = fVar1;
      auVar11._8_4_ = fVar1;
      auVar11._12_4_ = fVar1;
      auVar11._16_4_ = fVar1;
      auVar11._20_4_ = fVar1;
      auVar11._24_4_ = fVar1;
      auVar11._28_4_ = fVar1;
      auVar11 = vfmadd213ps_avx512vl(auVar20,auVar2,auVar11);
      auVar11 = vmaxps_avx(auVar11,ZEXT1632(ZEXT816(0) << 0x40));
      auVar11 = vminps_avx(auVar11,auVar15);
      auVar4._4_4_ = auVar11._4_4_ * auVar2._4_4_;
      auVar4._0_4_ = auVar11._0_4_ * auVar2._0_4_;
      auVar4._8_4_ = auVar11._8_4_ * auVar2._8_4_;
      auVar4._12_4_ = auVar11._12_4_ * auVar2._12_4_;
      auVar4._16_4_ = auVar11._16_4_ * auVar2._16_4_;
      auVar4._20_4_ = auVar11._20_4_ * auVar2._20_4_;
      auVar4._24_4_ = auVar11._24_4_ * auVar2._24_4_;
      auVar4._28_4_ = auVar2._28_4_;
      *(undefined1 (*) [32])*pauVar8 = auVar4;
      pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
    }
    for (; iVar9 + 3 < iVar5; iVar9 = iVar9 + 4) {
      auVar3 = *(undefined1 (*) [16])*pauVar8;
      fVar1 = (this->super_HardSwish).alpha;
      auVar19._4_4_ = fVar1;
      auVar19._0_4_ = fVar1;
      auVar19._8_4_ = fVar1;
      auVar19._12_4_ = fVar1;
      fVar1 = (this->super_HardSwish).beta;
      auVar10._4_4_ = fVar1;
      auVar10._0_4_ = fVar1;
      auVar10._8_4_ = fVar1;
      auVar10._12_4_ = fVar1;
      auVar10 = vfmadd213ps_avx512vl(auVar19,auVar3,auVar10);
      auVar10 = vmaxps_avx(auVar10,ZEXT816(0) << 0x40);
      auVar10 = vminps_avx(auVar10,auVar16);
      auVar17._0_4_ = auVar10._0_4_ * auVar3._0_4_;
      auVar17._4_4_ = auVar10._4_4_ * auVar3._4_4_;
      auVar17._8_4_ = auVar10._8_4_ * auVar3._8_4_;
      auVar17._12_4_ = auVar10._12_4_ * auVar3._12_4_;
      *(undefined1 (*) [16])*pauVar8 = auVar17;
      pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
    }
    for (; iVar9 < iVar5; iVar9 = iVar9 + 1) {
      fVar1 = *(float *)*pauVar8;
      fVar18 = 0.0;
      if (fVar1 < (this->super_HardSwish).lower) {
LAB_00423902:
        *(float *)*pauVar8 = fVar18;
      }
      else if (fVar1 <= (this->super_HardSwish).upper) {
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)(this->super_HardSwish).alpha),ZEXT416((uint)fVar1),
                                 ZEXT416((uint)(this->super_HardSwish).beta));
        fVar18 = auVar3._0_4_ * fVar1;
        goto LAB_00423902;
      }
      pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int HardSwish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}